

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParsePHPCoverage.cxx
# Opt level: O0

bool __thiscall cmParsePHPCoverage::ReadPHPData(cmParsePHPCoverage *this,char *file)

{
  cmCTest *this_00;
  byte bVar1;
  char *msg;
  ostringstream cmCTestLog_msg_2;
  ostringstream cmCTestLog_msg_1;
  string local_3d8 [4];
  int i;
  undefined1 local_3b8 [8];
  ostringstream cmCTestLog_msg;
  int local_23c;
  undefined4 uStack_238;
  char c;
  int size;
  long local_228;
  ifstream in;
  char *file_local;
  cmParsePHPCoverage *this_local;
  
  std::ifstream::ifstream(&local_228,file,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar1 & 1) == 0) {
    local_23c = 0;
    ReadArraySize(this,(istream *)&local_228,&local_23c);
    std::istream::get((char *)&local_228);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
    std::operator<<((ostream *)local_3b8,"failed to read open array\n");
    this_00 = this->CTest;
    std::__cxx11::ostringstream::str();
    msg = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(this_00,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParsePHPCoverage.cxx"
                 ,0xb7,msg,false);
    std::__cxx11::string::~string(local_3d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
  }
  uStack_238 = 1;
  std::ifstream::~ifstream(&local_228);
  return false;
}

Assistant:

bool cmParsePHPCoverage::ReadPHPData(const char* file)
{
  cmsys::ifstream in(file);
  if (!in) {
    return false;
  }
  int size = 0;
  this->ReadArraySize(in, size);
  char c = 0;
  in.get(c);
  if (c != '{') {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "failed to read open array\n");
    return false;
  }
  for (int i = 0; i < size; i++) {
    if (!this->ReadFileInformation(in)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Failed to read file #" << i << "\n");
      return false;
    }
    in.get(c);
    if (c != '}') {
      cmCTestLog(this->CTest, ERROR_MESSAGE, "failed to read close array\n");
      return false;
    }
  }
  return true;
}